

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

void __thiscall Symbol_Table::set_data(Symbol_Table *this,string *name,string *type,string *kind)

{
  bool bVar1;
  int iVar2;
  mapped_type pIVar3;
  mapped_type *ppIVar4;
  
  pIVar3 = (mapped_type)operator_new(0x48);
  (pIVar3->type)._M_dataplus._M_p = (pointer)&(pIVar3->type).field_2;
  (pIVar3->type)._M_string_length = 0;
  (pIVar3->type).field_2._M_local_buf[0] = '\0';
  (pIVar3->kind)._M_dataplus._M_p = (pointer)&(pIVar3->kind).field_2;
  (pIVar3->kind)._M_string_length = 0;
  (pIVar3->kind).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)pIVar3);
  std::__cxx11::string::_M_assign((string *)&pIVar3->kind);
  bVar1 = std::operator==(kind,"ARG");
  if (!bVar1) {
    bVar1 = std::operator==(kind,"VAR");
    if (!bVar1) {
      ppIVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
                ::operator[](&this->class_scope,name);
      *ppIVar4 = pIVar3;
      bVar1 = std::operator==(kind,"FIELD");
      if (bVar1) {
        iVar2 = this->field_count;
        this->field_count = iVar2 + 1;
      }
      else {
        iVar2 = this->static_count;
        this->static_count = iVar2 + 1;
      }
      goto LAB_0013663a;
    }
  }
  ppIVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
            ::operator[](&this->subroutine_scope,name);
  *ppIVar4 = pIVar3;
  bVar1 = std::operator==(kind,"ARG");
  if (bVar1) {
    iVar2 = this->arg_count;
    this->arg_count = iVar2 + 1;
  }
  else {
    iVar2 = this->var_count;
    this->var_count = iVar2 + 1;
  }
LAB_0013663a:
  pIVar3->index = iVar2;
  return;
}

Assistant:

void Symbol_Table::set_data(const std::string& name, const std::string& type, const std::string& kind) {
    auto *identifier_data = new IdentifierData;
    identifier_data->type = type;
    identifier_data->kind = kind;

    if (kind == "ARG" || kind == "VAR") {
        subroutine_scope[name] = identifier_data;
        if (kind == "ARG") {
            identifier_data->index = arg_count++;
        }
        else {
            identifier_data->index = var_count++;
        }
    }
    else {
        class_scope[name] = identifier_data;
        if (kind == "FIELD") {
            identifier_data->index = field_count++;
        }
        else {
            identifier_data->index = static_count++;
        }
    }
}